

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher.cpp
# Opt level: O0

void __thiscall FileSystemWatcher::processChanges(FileSystemWatcher *this,uint types)

{
  Signal<std::function<void(Path_const&)>> *this_00;
  bool bVar1;
  reference args;
  _Self local_c8;
  _Self local_c0;
  const_iterator it;
  lock_guard<std::mutex> local_a8;
  lock_guard<std::mutex> lock;
  Set<Path> p;
  uint i;
  uint count;
  anon_struct_24_3_203d5c27 signals [3];
  uint types_local;
  FileSystemWatcher *this_local;
  
  if (types != 0) {
    i = 1;
    signals[0]._0_8_ = &this->mAdded;
    signals[0].signal = (Signal<std::function<void_(const_Path_&)>_> *)&this->mAddedPaths;
    signals[0].paths._0_4_ = 2;
    signals[1]._0_8_ = &this->mRemoved;
    signals[1].signal = (Signal<std::function<void_(const_Path_&)>_> *)&this->mRemovedPaths;
    signals[1].paths._0_4_ = 4;
    signals[2]._0_8_ = &this->mModified;
    signals[2].signal = (Signal<std::function<void_(const_Path_&)>_> *)&this->mModifiedPaths;
    for (p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.
         super__Rb_tree_header._M_node_count._0_4_ = 0;
        (uint)p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.
              super__Rb_tree_header._M_node_count < 3;
        p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.super__Rb_tree_header
        ._M_node_count._0_4_ =
             (uint)p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.
                   super__Rb_tree_header._M_node_count + 1) {
      if ((types & (&i)[(ulong)(uint)p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t.
                                     _M_impl.super__Rb_tree_header._M_node_count * 6]) != 0) {
        Set<Path>::Set((Set<Path> *)&lock);
        std::lock_guard<std::mutex>::lock_guard(&local_a8,&this->mMutex);
        std::swap<Set<Path>>
                  ((Set<Path> *)&lock,
                   (Set<Path> *)
                   signals[(uint)p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t.
                                 _M_impl.super__Rb_tree_header._M_node_count].signal);
        std::lock_guard<std::mutex>::~lock_guard(&local_a8);
        local_c0._M_node =
             (_Base_ptr)
             std::set<Path,_std::less<Path>,_std::allocator<Path>_>::begin
                       ((set<Path,_std::less<Path>,_std::allocator<Path>_> *)&lock);
        while( true ) {
          local_c8._M_node =
               (_Base_ptr)
               std::set<Path,_std::less<Path>,_std::allocator<Path>_>::end
                         ((set<Path,_std::less<Path>,_std::allocator<Path>_> *)&lock);
          bVar1 = std::operator!=(&local_c0,&local_c8);
          if (!bVar1) break;
          this_00 = *(Signal<std::function<void(Path_const&)>> **)
                     (signals +
                     (uint)p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.
                           super__Rb_tree_header._M_node_count);
          args = std::_Rb_tree_const_iterator<Path>::operator*(&local_c0);
          Signal<std::function<void(Path_const&)>>::operator()(this_00,args);
          std::_Rb_tree_const_iterator<Path>::operator++(&local_c0);
        }
        Set<Path>::~Set((Set<Path> *)&lock);
      }
    }
    return;
  }
  __assert_fail("types",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/FileSystemWatcher.cpp"
                ,0x22,"void FileSystemWatcher::processChanges(unsigned int)");
}

Assistant:

void FileSystemWatcher::processChanges(unsigned int types)
{
    assert(types);
    struct {
        const Type type;
        Signal<std::function<void(const Path&)> > &signal;
        Set<Path> &paths;
    } signals[] = {
        { Add, mAdded, mAddedPaths },
        { Remove, mRemoved, mRemovedPaths },
        { Modified, mModified, mModifiedPaths }
    };

    const unsigned int count = sizeof(signals) / sizeof(signals[0]);
    for (unsigned i=0; i<count; ++i) {
        if (types & signals[i].type) {
            Set<Path> p;
            {
                std::lock_guard<std::mutex> lock(mMutex);
                std::swap(p, signals[i].paths);
            }

            for (Set<Path>::const_iterator it = p.begin(); it != p.end(); ++it) {
                signals[i].signal(*it);
            }
        }
    }
}